

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O0

int ConnectSeanet(SEANET *pSeanet,char *szCfgFilePath)

{
  int iVar1;
  char *pcVar2;
  char local_128 [8];
  char line [256];
  FILE *file;
  char *szCfgFilePath_local;
  SEANET *pSeanet_local;
  
  line[0xf8] = '\0';
  line[0xf9] = '\0';
  line[0xfa] = '\0';
  line[0xfb] = '\0';
  line[0xfc] = '\0';
  line[0xfd] = '\0';
  line[0xfe] = '\0';
  line[0xff] = '\0';
  memset(pSeanet->szCfgFilePath,0,0x100);
  sprintf(pSeanet->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(local_128,0,0x100);
    memset(pSeanet->szDevPath,0,0x100);
    sprintf(pSeanet->szDevPath,"COM1");
    pSeanet->BaudRate = 0x1c200;
    pSeanet->timeout = 0x5dc;
    pSeanet->threadperiod = 100;
    pSeanet->bSaveRawData = 1;
    pSeanet->RangeScale = 0x1e;
    pSeanet->Gain = 0x32;
    pSeanet->Sensitivity = 3;
    pSeanet->Contrast = 0x19;
    pSeanet->ScanDirection = 0;
    pSeanet->ScanWidth = 0x168;
    pSeanet->StepAngleSize = 3.6;
    pSeanet->NBins = 200;
    pSeanet->adc8on = 1;
    pSeanet->scanright = 0;
    pSeanet->invert = 0;
    pSeanet->stareLLim = 0;
    pSeanet->VelocityOfSound = 0x5dc;
    pSeanet->alpha_max_err = 0.01;
    pSeanet->d_max_err = 0.1;
    pSeanet->HorizontalBeam = 3;
    pSeanet->VerticalBeam = 0x28;
    line._248_8_ = fopen(szCfgFilePath,"r");
    if ((FILE *)line._248_8_ == (FILE *)0x0) {
      printf("Configuration file not found.\n");
    }
    else {
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%255s",pSeanet->szDevPath);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->BaudRate);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->timeout);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->threadperiod);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->bSaveRawData);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->RangeScale);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->Gain);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->Sensitivity);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->Contrast);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->ScanDirection);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->ScanWidth);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%lf",&pSeanet->StepAngleSize);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->NBins);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->adc8on);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->scanright);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->invert);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->stareLLim);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->VelocityOfSound);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%lf",&pSeanet->alpha_max_err);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%lf",&pSeanet->d_max_err);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->HorizontalBeam);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pSeanet->VerticalBeam);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = fclose((FILE *)line._248_8_);
      if (iVar1 != 0) {
        printf("fclose() failed.\n");
      }
    }
  }
  if (pSeanet->threadperiod < 0) {
    printf("Invalid parameter : threadperiod.\n");
    pSeanet->threadperiod = 100;
  }
  if ((pSeanet->ScanDirection < 0) || (0x167 < pSeanet->ScanDirection)) {
    printf("Invalid parameter : ScanDirection.\n");
    pSeanet->ScanDirection = 0;
  }
  if ((pSeanet->ScanWidth < 2) || (0x168 < pSeanet->ScanWidth)) {
    printf("Invalid parameter : ScanWidth.\n");
    pSeanet->ScanWidth = 0x168;
  }
  if (pSeanet->VelocityOfSound < 1) {
    printf("Invalid parameter : VelocityOfSound.\n");
    pSeanet->VelocityOfSound = 0x5dc;
  }
  if ((pSeanet->HorizontalBeam < 1) || (0x168 < pSeanet->HorizontalBeam)) {
    printf("Invalid parameter : HorizontalBeam.\n");
    pSeanet->HorizontalBeam = 3;
  }
  if ((pSeanet->VerticalBeam < 1) || (0x168 < pSeanet->VerticalBeam)) {
    printf("Invalid parameter : VerticalBeam.\n");
    pSeanet->VerticalBeam = 0x28;
  }
  iVar1 = OpenRS232Port(&pSeanet->RS232Port,pSeanet->szDevPath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(&pSeanet->RS232Port,pSeanet->BaudRate,'\0',0,'\b','\0',
                                pSeanet->timeout);
    if (iVar1 == 0) {
      iVar1 = GetLatestAliveMsgSeanet(pSeanet);
      if (iVar1 == 0) {
        iVar1 = RebootSeanet(pSeanet);
        if (iVar1 == 0) {
          iVar1 = GetVersionSeanet(pSeanet);
          if (iVar1 == 0) {
            iVar1 = GetBBUserSeanet(pSeanet);
            if (iVar1 == 0) {
              iVar1 = SetHeadCommandSeanet(pSeanet);
              if (iVar1 == 0) {
                printf("Seanet connected.\n");
                pSeanet_local._4_4_ = 0;
              }
              else {
                printf("Unable to connect to a Seanet.\n");
                CloseRS232Port(&pSeanet->RS232Port);
                pSeanet_local._4_4_ = 1;
              }
            }
            else {
              printf("Unable to connect to a Seanet.\n");
              CloseRS232Port(&pSeanet->RS232Port);
              pSeanet_local._4_4_ = 1;
            }
          }
          else {
            printf("Unable to connect to a Seanet.\n");
            CloseRS232Port(&pSeanet->RS232Port);
            pSeanet_local._4_4_ = 1;
          }
        }
        else {
          printf("Unable to connect to a Seanet.\n");
          CloseRS232Port(&pSeanet->RS232Port);
          pSeanet_local._4_4_ = 1;
        }
      }
      else {
        printf("Unable to connect to a Seanet.\n");
        CloseRS232Port(&pSeanet->RS232Port);
        pSeanet_local._4_4_ = 1;
      }
    }
    else {
      printf("Unable to connect to a Seanet.\n");
      CloseRS232Port(&pSeanet->RS232Port);
      pSeanet_local._4_4_ = 1;
    }
  }
  else {
    printf("Unable to connect to a Seanet.\n");
    pSeanet_local._4_4_ = 1;
  }
  return pSeanet_local._4_4_;
}

Assistant:

inline int ConnectSeanet(SEANET* pSeanet, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pSeanet->szCfgFilePath, 0, sizeof(pSeanet->szCfgFilePath));
	sprintf(pSeanet->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pSeanet->szDevPath, 0, sizeof(pSeanet->szDevPath));
		sprintf(pSeanet->szDevPath, "COM1");
		pSeanet->BaudRate = 115200;
		pSeanet->timeout = 1500;
		pSeanet->threadperiod = 100;
		pSeanet->bSaveRawData = 1;
		pSeanet->RangeScale = 30;
		pSeanet->Gain = 50;
		pSeanet->Sensitivity = 3;
		pSeanet->Contrast = 25;
		pSeanet->ScanDirection = 0;
		pSeanet->ScanWidth = 360;
		pSeanet->StepAngleSize = 3.6;
		pSeanet->NBins = 200;
		pSeanet->adc8on = 1;
		pSeanet->scanright = 0;
		pSeanet->invert = 0;
		pSeanet->stareLLim = 0;
		pSeanet->VelocityOfSound = 1500;
		pSeanet->alpha_max_err = 0.01;
		pSeanet->d_max_err = 0.1;
		pSeanet->HorizontalBeam = 3;
		pSeanet->VerticalBeam = 40;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pSeanet->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->RangeScale) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->Gain) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->Sensitivity) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->Contrast) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->ScanDirection) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->ScanWidth) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSeanet->StepAngleSize) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->NBins) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->adc8on) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->scanright) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->invert) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->stareLLim) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->VelocityOfSound) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSeanet->alpha_max_err) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pSeanet->d_max_err) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->HorizontalBeam) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSeanet->VerticalBeam) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pSeanet->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pSeanet->threadperiod = 100;
	}
	if ((pSeanet->ScanDirection < 0)||(pSeanet->ScanDirection > 359))
	{
		printf("Invalid parameter : ScanDirection.\n");
		pSeanet->ScanDirection = 0;
	}
	if ((pSeanet->ScanWidth < 2)||(pSeanet->ScanWidth > 360))
	{
		printf("Invalid parameter : ScanWidth.\n");
		pSeanet->ScanWidth = 360;
	}
	if (pSeanet->VelocityOfSound <= 0)
	{
		printf("Invalid parameter : VelocityOfSound.\n");
		pSeanet->VelocityOfSound = 1500;
	}
	if ((pSeanet->HorizontalBeam <= 0)||(pSeanet->HorizontalBeam > 360))
	{
		printf("Invalid parameter : HorizontalBeam.\n");
		pSeanet->HorizontalBeam = 3;
	}
	if ((pSeanet->VerticalBeam <= 0)||(pSeanet->VerticalBeam > 360))
	{
		printf("Invalid parameter : VerticalBeam.\n");
		pSeanet->VerticalBeam = 40;
	}

	// Used to save raw data, should be handled specifically...
	//pSeanet->pfSaveFile = NULL;

	if (OpenRS232Port(&pSeanet->RS232Port, pSeanet->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pSeanet->RS232Port, pSeanet->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pSeanet->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	if (GetLatestAliveMsgSeanet(pSeanet) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	if (RebootSeanet(pSeanet) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	if (GetVersionSeanet(pSeanet) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	if (GetBBUserSeanet(pSeanet) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	if (SetHeadCommandSeanet(pSeanet) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Seanet.\n");
		CloseRS232Port(&pSeanet->RS232Port);
		return EXIT_FAILURE;
	}

	printf("Seanet connected.\n");

	return EXIT_SUCCESS;
}